

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_e7a7b8::SegmentTree::produceIntersections
          (SegmentTree *this,TreeNode *node,int segment,RectF *segmentBounds,RectF *nodeBounds,
          int axis)

{
  QDataBuffer<QIntersection> *this_00;
  double dVar1;
  double dVar2;
  int index;
  Segment *pSVar3;
  QPathSegments *this_01;
  Segment *pSVar4;
  QIntersection *pQVar5;
  undefined1 auVar6 [16];
  QPointF QVar7;
  undefined1 auVar8 [16];
  qreal qVar9;
  qreal qVar10;
  qreal qVar11;
  qreal qVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined7 extraout_var;
  long lVar19;
  long lVar20;
  int k;
  long lVar21;
  long in_FS_OFFSET;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  Intersection IVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dStack_100;
  QLineF local_d8;
  RectF local_b8;
  Intersection i_isect;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (node->leaf == true) {
    pSVar3 = (this->m_segments->m_segments).buffer;
    local_b8.x2 = -NAN;
    local_b8.y2 = -NAN;
    local_b8.x1 = -NAN;
    local_b8.y1 = -NAN;
    QPathSegments::lineAt((QLineF *)&local_b8,this->m_segments,segment);
    lVar19 = (long)(node->index).interval.first;
    this_00 = &this->m_intersections;
    while( true ) {
      if ((node->index).interval.last <= lVar19) break;
      index = (this->m_index).d.ptr[lVar19];
      if (index < segment) {
        this_01 = this->m_segments;
        pSVar4 = (this_01->m_segments).buffer;
        dVar1 = pSVar3[segment].bounds.xp;
        dVar2 = pSVar4[index].bounds.xp;
        if ((dVar1 <= pSVar4[index].bounds.w + dVar2) && (dVar2 <= dVar1 + pSVar3[segment].bounds.w)
           ) {
          dVar1 = pSVar3[segment].bounds.yp;
          dVar2 = pSVar4[index].bounds.yp;
          if ((dVar1 <= pSVar4[index].bounds.h + dVar2) &&
             (dVar2 <= dVar1 + pSVar3[segment].bounds.h)) {
            (this->m_intersections).siz = 0;
            local_d8.pt2.xp._0_4_ = 0xffffffff;
            local_d8.pt2.xp._4_4_ = 0xffffffff;
            local_d8.pt2.yp._0_4_ = 0xffffffff;
            local_d8.pt2.yp._4_4_ = 0xffffffff;
            local_d8.pt1.xp._0_4_ = 0xffffffff;
            local_d8.pt1.xp._4_4_ = 0xffffffff;
            local_d8.pt1.yp._0_4_ = 0xffffffff;
            local_d8.pt1.yp._4_4_ = 0xffffffff;
            QPathSegments::lineAt(&local_d8,this_01,index);
            qVar12 = local_b8.y2;
            qVar11 = local_b8.x2;
            qVar10 = local_b8.y1;
            qVar9 = local_b8.x1;
            local_48._0_8_ = local_b8.x1;
            local_48._8_8_ = local_b8.y1;
            local_58.xp = local_b8.x2;
            local_58.yp = local_b8.y2;
            dVar1 = (double)CONCAT44(local_d8.pt1.xp._4_4_,local_d8.pt1.xp._0_4_);
            dVar2 = (double)CONCAT44(local_d8.pt1.yp._4_4_,local_d8.pt1.yp._0_4_);
            dVar36 = (double)CONCAT44(local_d8.pt2.xp._4_4_,local_d8.pt2.xp._0_4_);
            QVar7.yp._0_4_ = local_d8.pt2.yp._0_4_;
            QVar7.xp = dVar36;
            QVar7.yp._4_4_ = local_d8.pt2.yp._4_4_;
            local_78 = QVar7;
            local_68.xp = dVar1;
            local_68.yp = dVar2;
            bVar13 = comparePoints((QPointF *)local_48,&local_58);
            if ((!bVar13) && (bVar13 = comparePoints(&local_68,&local_78), !bVar13)) {
              bVar13 = comparePoints((QPointF *)local_48,&local_68);
              bVar14 = comparePoints(&local_58,&local_78);
              if (!bVar13 || !bVar14) {
                bVar15 = comparePoints((QPointF *)local_48,&local_78);
                bVar16 = comparePoints(&local_58,&local_68);
                if (!bVar15 || !bVar16) {
                  dStack_100 = QVar7.yp;
                  dVar38 = dVar36 - dVar1;
                  dVar39 = qVar11 - qVar9;
                  dVar40 = dStack_100 - dVar2;
                  dVar41 = qVar12 - qVar10;
                  auVar27._0_8_ = dVar39 * dVar40 - dVar38 * dVar41;
                  dVar30 = (double)((ulong)auVar27._0_8_ ^ (ulong)DAT_005c3770);
                  uVar22 = -(ulong)(auVar27._0_8_ < dVar30);
                  if ((double)(~uVar22 & (ulong)auVar27._0_8_ | (ulong)dVar30 & uVar22) <= 1e-12) {
                    dVar30 = (double)((ulong)dVar41 ^ (ulong)DAT_005c3770) * (dVar1 - qVar9) +
                             dVar39 * (dVar2 - qVar10);
                    uVar22 = -(ulong)(dVar30 < -dVar30);
                    if ((double)(~uVar22 & (ulong)dVar30 | (ulong)-dVar30 & uVar22) <= 1e-12) {
                      dVar33 = 1.0 / (dVar39 * dVar39 + dVar41 * dVar41);
                      dVar30 = ((dVar1 - qVar9) * dVar39 + (dVar2 - qVar10) * dVar41) * dVar33;
                      if ((0.0 < dVar30) && (dVar30 < 1.0)) {
                        i_isect.vertex = 0;
                        i_isect.next = 0;
                        i_isect.t = dVar30;
                        local_88.yp = local_68.yp;
                        local_88.xp = local_68.xp;
                        QDataBuffer<QIntersection>::add(this_00,(QIntersection *)&i_isect);
                      }
                      dVar33 = dVar33 * (dVar39 * (dVar36 - qVar9) + dVar41 * (dStack_100 - qVar10))
                      ;
                      if ((0.0 < dVar33) && (dVar33 < 1.0)) {
                        i_isect.vertex = 0;
                        i_isect.next = 0x3ff00000;
                        i_isect.t = dVar33;
                        local_88 = local_78;
                        QDataBuffer<QIntersection>::add(this_00,(QIntersection *)&i_isect);
                      }
                      dVar36 = 1.0 / (dVar38 * dVar38 + dVar40 * dVar40);
                      dVar30 = ((qVar9 - dVar1) * dVar38 + (qVar10 - dVar2) * dVar40) * dVar36;
                      if ((0.0 < dVar30) && (dVar30 < 1.0)) {
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = dVar30;
                        i_isect = (Intersection)(auVar8 << 0x40);
                        local_88.yp = (qreal)local_48._8_8_;
                        local_88.xp = (qreal)local_48._0_8_;
                        QDataBuffer<QIntersection>::add(this_00,(QIntersection *)&i_isect);
                      }
                      dVar36 = ((qVar12 - dVar2) * dVar40 + dVar38 * (qVar11 - dVar1)) * dVar36;
                      if ((0.0 < dVar36) && (dVar36 < 1.0)) {
                        i_isect._8_8_ = dVar36;
                        i_isect.t = 1.0;
                        local_88.yp = local_58.yp;
                        local_88.xp = local_58.xp;
LAB_003a236d:
                        QDataBuffer<QIntersection>::add(this_00,(QIntersection *)&i_isect);
                      }
                    }
                  }
                  else if ((!bVar14 && !bVar16) && (!bVar13 && !bVar15)) {
                    auVar24._0_8_ = (dVar1 - qVar9) * dVar40 - (dVar2 - qVar10) * dVar38;
                    auVar24._8_8_ = (dVar1 - qVar9) * dVar41 - (dVar2 - qVar10) * dVar39;
                    auVar27._8_8_ = auVar27._0_8_;
                    IVar25 = (Intersection)divpd(auVar24,auVar27);
                    dVar36 = IVar25.t;
                    dVar30 = IVar25._8_8_;
                    if ((((dVar30 <= 1.0) && (0.0 <= dVar30)) && (0.0 <= dVar36)) && (dVar36 <= 1.0)
                       ) {
                      dVar39 = dVar36 + -1.0;
                      uVar22 = -(ulong)(dVar36 < -dVar36);
                      uVar23 = -(ulong)(dVar39 < -dVar39);
                      auVar34._0_8_ = (ulong)-dVar36 & uVar22;
                      auVar34._8_8_ = (ulong)-dVar39 & uVar23;
                      auVar28._0_8_ = ~uVar22 & (ulong)dVar36;
                      auVar28._8_8_ = ~uVar23 & (ulong)dVar39;
                      uVar22 = -(ulong)(dVar30 < -dVar30);
                      dVar41 = (double)(~uVar22 & (ulong)dVar30 | (ulong)-dVar30 & uVar22);
                      dVar36 = dVar30 + -1.0;
                      uVar22 = -(ulong)(dVar36 < -dVar36);
                      dVar33 = (double)(~uVar22 & (ulong)dVar36 | (ulong)-dVar36 & uVar22);
                      dVar36 = SUB168(auVar28 | auVar34,0);
                      dVar39 = SUB168(auVar28 | auVar34,8);
                      auVar37._8_8_ = -(ulong)(dVar39 <= 1e-12);
                      auVar37._0_8_ = -(ulong)(dVar36 <= 1e-12);
                      iVar17 = movmskpd((int)CONCAT71(extraout_var,bVar16),auVar37);
                      if ((1e-12 < dVar41 && 1e-12 < dVar33) || (iVar17 == 0)) {
                        uVar22 = -(ulong)(dVar36 <= 1e-12);
                        uVar23 = -(ulong)(dVar39 <= 1e-12);
                        auVar35._0_8_ = (ulong)qVar11 & uVar23;
                        auVar35._8_8_ = (ulong)qVar12 & uVar23;
                        auVar32._0_8_ = ~uVar23 & (ulong)dVar1;
                        auVar32._8_8_ = ~uVar23 & (ulong)dVar2;
                        uVar18 = (uint)(dVar33 <= 1e-12);
                        auVar26._0_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
                        auVar26._4_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
                        auVar26._8_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
                        auVar26._12_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
                        auVar6._8_8_ = dVar40 * dVar30 + dVar2;
                        auVar6._0_8_ = dVar38 * dVar30 + dVar1;
                        uVar18 = (uint)(dVar41 <= 1e-12 || iVar17 != 0);
                        auVar31._0_8_ =
                             CONCAT44((int)(uVar18 << 0x1f) >> 0x1f,(int)(uVar18 << 0x1f) >> 0x1f);
                        auVar31._8_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
                        auVar31._12_4_ = (int)(uVar18 << 0x1f) >> 0x1f;
                        auVar29._0_8_ =
                             (~uVar22 & SUB168(auVar32 | auVar35,0) | (ulong)qVar9 & uVar22) &
                             auVar31._0_8_;
                        auVar29._8_8_ =
                             (~uVar22 & SUB168(auVar32 | auVar35,8) | (ulong)qVar10 & uVar22) &
                             auVar31._8_8_;
                        local_88 = (QPointF)(~auVar31 &
                                             (~auVar26 & auVar6 | (undefined1  [16])QVar7 & auVar26)
                                            | auVar29);
                        i_isect = IVar25;
                        goto LAB_003a236d;
                      }
                    }
                  }
                }
              }
            }
            lVar20 = 0x10;
            for (lVar21 = 0; lVar21 < (this->m_intersections).siz; lVar21 = lVar21 + 1) {
              local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              pQVar5 = (this->m_intersections).buffer;
              i_isect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              i_isect.t = *(qreal *)((long)pQVar5 + lVar20 + -0x10);
              local_48._0_8_ = *(double *)((long)pQVar5 + lVar20 + -8);
              local_48._8_4_ =
                   QPathSegments::addPoint
                             (this->m_segments,(QPointF *)((long)&pQVar5->alphaA + lVar20));
              i_isect.vertex = local_48._8_4_;
              i_isect.next = 0;
              local_48._12_4_ = 0;
              QPathSegments::addIntersection(this->m_segments,segment,&i_isect);
              QPathSegments::addIntersection(this->m_segments,index,(Intersection *)local_48);
              lVar20 = lVar20 + 0x20;
            }
          }
        }
      }
      lVar19 = lVar19 + 1;
    }
  }
  else {
    i_isect = *(Intersection *)nodeBounds;
    local_88.xp = nodeBounds->x2;
    local_88.yp = nodeBounds->y2;
    dVar1 = node->splitLeft;
    (&local_88.xp)[(uint)axis] = dVar1;
    local_b8.x1 = nodeBounds->x1;
    local_b8.y1 = nodeBounds->y1;
    local_b8.x2 = nodeBounds->x2;
    local_b8.y2 = nodeBounds->y2;
    (&local_b8.x1)[(uint)axis] = node->splitRight;
    if ((node->lowestLeftIndex < segment) && ((&segmentBounds->x1)[(uint)axis] <= dVar1)) {
      produceIntersections
                (this,(this->m_tree).d.ptr + (node->index).interval.first,segment,segmentBounds,
                 (RectF *)&i_isect,(uint)(axis == 0));
    }
    if ((node->lowestRightIndex < segment) && (node->splitRight <= (&segmentBounds->x2)[(uint)axis])
       ) {
      produceIntersections
                (this,(this->m_tree).d.ptr + (node->index).interval.last,segment,segmentBounds,
                 &local_b8,(uint)(axis == 0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SegmentTree::produceIntersections(const TreeNode &node, int segment, const RectF &segmentBounds, const RectF &nodeBounds, int axis)
{
    if (node.leaf) {
        produceIntersectionsLeaf(node, segment);
        return;
    }

    RectF lbounds = nodeBounds;
    (&lbounds.x2)[axis] = node.splitLeft;

    RectF rbounds = nodeBounds;
    (&rbounds.x1)[axis] = node.splitRight;

    if (segment > node.lowestLeftIndex && (&segmentBounds.x1)[axis] <= node.splitLeft)
        produceIntersections(m_tree.at(node.index.children.left), segment, segmentBounds, lbounds, !axis);

    if (segment > node.lowestRightIndex && (&segmentBounds.x2)[axis] >= node.splitRight)
        produceIntersections(m_tree.at(node.index.children.right), segment, segmentBounds, rbounds, !axis);
}